

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O1

OPTIONHANDLER_HANDLE
OptionHandler_Create(pfCloneOption cloneOption,pfDestroyOption destroyOption,pfSetOption setOption)

{
  LOGGER_LOG p_Var1;
  OPTIONHANDLER_HANDLE pOVar2;
  
  if ((destroyOption == (pfDestroyOption)0x0 || cloneOption == (pfCloneOption)0x0) ||
      setOption == (pfSetOption)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                ,"OptionHandler_Create",0x88,1,
                "invalid parameter = pfCloneOption cloneOption=%p, pfDestroyOption destroyOption=%p, pfSetOption setOption=%p"
                ,cloneOption,destroyOption,setOption);
    }
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  pOVar2 = CreateInternal(cloneOption,destroyOption,setOption);
  return pOVar2;
}

Assistant:

OPTIONHANDLER_HANDLE OptionHandler_Create(pfCloneOption cloneOption, pfDestroyOption destroyOption, pfSetOption setOption)
{
    /*Codes_SRS_OPTIONHANDLER_02_001: [ OptionHandler_Create shall fail and retun NULL if any parameters are NULL. ]*/
    OPTIONHANDLER_HANDLE_DATA* result;
    if (
        (cloneOption == NULL) ||
        (destroyOption == NULL) ||
        (setOption == NULL)
        )
    {
        LogError("invalid parameter = pfCloneOption cloneOption=%p, pfDestroyOption destroyOption=%p, pfSetOption setOption=%p", cloneOption, destroyOption, setOption);
        result = NULL;
    }
    else
    {
        result = CreateInternal(cloneOption, destroyOption, setOption);
    }

    return result;

}